

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O3

Node * __thiscall M_tree::delete_one_leaf(M_tree *this,Node *tail)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node **ppNVar4;
  
  pNVar1 = tail->parent;
  do {
    pNVar3 = pNVar1;
    if (pNVar3 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar1 = pNVar3->left;
    pNVar2 = pNVar3->right;
    if (tail == pNVar1) {
      ppNVar4 = &pNVar3->left;
      if ((pNVar2 != (Node *)0x0) &&
         ((ppNVar4 = &pNVar3->right, pNVar1 != (Node *)0x0 || (tail != pNVar2)))) {
        pNVar3->left = (Node *)0x0;
LAB_00105da7:
        if (tail == pNVar2) {
          pNVar3->right = (Node *)0x0;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tail->key);
        operator_delete(tail,0x50);
        return pNVar3;
      }
    }
    else if ((pNVar1 != (Node *)0x0) || (ppNVar4 = &pNVar3->right, tail != pNVar2))
    goto LAB_00105da7;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tail->key);
    operator_delete(tail,0x50);
    *ppNVar4 = (Node *)0x0;
    pNVar1 = pNVar3->parent;
    tail = pNVar3;
  } while( true );
}

Assistant:

Node *M_tree::delete_one_leaf(Node *tail) {
    Node* up = tail->parent;
    while(up!=NULL){
        if(tail == up->left && up->right == NULL){
            delete(tail);
            tail = up;
            up->left = NULL;
        }
        else if(tail == up->right && up->left == NULL){
            delete(tail);
            tail = up;
            up->right = NULL;
        }
        else{
            if(tail == up->left){
                up->left = NULL;
            }
            if(tail == up->right){
                up->right = NULL;
            }
            delete(tail);
            return up;
        }
        up = tail->parent;
    }
    return NULL;
}